

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

string * __thiscall
ritobin::io::write_json_abi_cxx11_
          (string *__return_storage_ptr__,io *this,Bin *value,
          vector<char,_std::allocator<char>_> *out,int indent_size)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_moonshadow565[P]ritobin_ritobin_lib_src_ritobin_bin_types_helper_hpp:24:31),_const_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_&>
  __s;
  reference this_00;
  long *plVar4;
  json json;
  undefined1 local_98 [8];
  json_value local_90;
  int local_84;
  undefined1 local_80 [8];
  json_value local_78;
  undefined1 local_70 [16];
  string *local_60;
  vector<char,std::allocator<char>> *local_58;
  string_t local_50;
  
  local_84 = (int)out;
  local_60 = __return_storage_ptr__;
  local_58 = (vector<char,std::allocator<char>> *)value;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_70,(initializer_list_t)ZEXT816(0),false,object);
  plVar4 = *(long **)(this + 0x10);
  if (plVar4 != (long *)0x0) {
    do {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_70,(key_type *)(plVar4 + 1));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_80,(initializer_list_t)ZEXT816(0),false,object);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_80);
      vVar1 = pvVar3->m_type;
      pvVar3->m_type = local_80[0];
      jVar2 = pvVar3->m_value;
      pvVar3->m_value = local_78;
      local_80[0] = vVar1;
      local_78 = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant(pvVar3);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_80);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy((json_value *)(local_80 + 8),local_80[0]);
      __s = std::
            visit<ritobin::ValueHelperImpl<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>::value_to_type_name(std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&)::_lambda(auto:1&&)_1_,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&>
                      ((anon_class_1_0_00000001 *)&local_50,(Value *)(plVar4 + 5));
      local_50._M_dataplus._M_p = (pointer)strlen(__s);
      local_50._M_string_length = (size_type)__s;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      basic_json<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_98,(basic_string_view<char,_std::char_traits<char>_> *)&local_50);
      this_00 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar3,"type");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_98);
      vVar1 = this_00->m_type;
      this_00->m_type = local_98[0];
      jVar2 = this_00->m_value;
      this_00->m_value = local_90;
      local_98[0] = vVar1;
      local_90 = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant(this_00);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_98);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy((json_value *)(local_98 + 8),local_98[0]);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)pvVar3,"value");
      json_impl::value_to_json((Value *)(plVar4 + 5),pvVar3);
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_50,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_70,local_84,' ',false,strict);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (local_58,*(undefined8 *)(local_58 + 8),local_50._M_dataplus._M_p,
             (__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_moonshadow565[P]ritobin_ritobin_lib_src_ritobin_bin_types_helper_hpp:24:31),_const_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_&>
              )(local_50._M_string_length + (long)local_50._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_70);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_70 + 8),local_70[0]);
  (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
  local_60->_M_string_length = 0;
  (local_60->field_2)._M_local_buf[0] = '\0';
  return local_60;
}

Assistant:

std::string write_json(Bin const& value, std::vector<char>& out, int indent_size) noexcept {
        bin_to_json(value, out, indent_size);
        return {};
    }